

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel_p.h
# Opt level: O0

QFlags<Qt::AlignmentFlag>
QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>(QVariant *data)

{
  int iVar1;
  int iVar2;
  bool *in_RDI;
  Int in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  iVar1 = QVariant::userType((QVariant *)0x198467);
  iVar2 = qMetaTypeId<QFlags<Qt::AlignmentFlag>>();
  if (iVar1 == iVar2) {
    local_4 = (Int)QVariant::value<QFlags<Qt::AlignmentFlag>>
                             ((QVariant *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  }
  else {
    QVariant::toInt(in_RDI);
    local_4 = (Int)QFlags<Qt::AlignmentFlag>::fromInt(in_stack_ffffffffffffffe8);
  }
  return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
         (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)local_4;
}

Assistant:

T legacyFlagValueFromModelData(const QVariant &data)
{
    if (data.userType() == qMetaTypeId<T>()) {
        return data.value<T>();
    } else if (std::is_same_v<std::underlying_type_t<typename T::enum_type>, int> ||
               std::is_same_v<std::underlying_type_t<typename T::enum_type>, uint>) {
        return T::fromInt(data.toInt());
    }

    return T();
}